

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OnDiskIndex.cpp
# Opt level: O0

void __thiscall OnDiskIndex::OnDiskIndex(OnDiskIndex *this,string *fname)

{
  bool bVar1;
  uint64_t uVar2;
  runtime_error *prVar3;
  ulong *in_RDI;
  __off_t in_R8;
  OnDiskIndexHeader header;
  path *in_stack_fffffffffffffee8;
  path *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff08;
  path *in_stack_ffffffffffffff10;
  path *in_stack_ffffffffffffff18;
  int local_ac;
  int local_a8;
  uint32_t local_a4;
  int in_stack_ffffffffffffff60;
  int in_stack_ffffffffffffff64;
  string *in_stack_ffffffffffffff68;
  RawFile *in_stack_ffffffffffffff70;
  RawFile *in_stack_ffffffffffffff90;
  
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  std::experimental::filesystem::v1::__cxx11::path::filename(in_stack_ffffffffffffff18);
  std::experimental::filesystem::v1::__cxx11::path::operator_cast_to_string
            (in_stack_fffffffffffffee8);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffef0);
  std::experimental::filesystem::v1::__cxx11::path::~path(in_stack_fffffffffffffef0);
  std::experimental::filesystem::v1::__cxx11::path::
  path<std::__cxx11::string,std::experimental::filesystem::v1::__cxx11::path>
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  RawFile::RawFile(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                   in_stack_ffffffffffffff60);
  uVar2 = RawFile::size(in_stack_ffffffffffffff90);
  *in_RDI = uVar2;
  if (*in_RDI < 0x8000018) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"corrupted index, file is too small");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  RawFile::pread((RawFile *)(in_RDI + 0xd),(int)&local_ac,(void *)0x10,0,in_R8);
  if (local_ac != 0xca7da7a) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"invalid magic, not a catdata");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_a8 != 6) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"unsupported version");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  bVar1 = is_valid_index_type(local_a4);
  if (!bVar1) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"invalid index type");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (in_stack_ffffffffffffff60 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"reserved field != 0");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *(uint32_t *)((long)in_RDI + 0x6c) = local_a4;
  return;
}

Assistant:

OnDiskIndex::OnDiskIndex(const std::string &fname)
    : fname(fs::path(fname).filename()),
      fpath(fs::path(fname)),
      ndxfile(fname) {
    OnDiskIndexHeader header;

    index_size = ndxfile.size();

    if (index_size < DATA_OFFSET + RUN_ARRAY_SIZE) {
        throw std::runtime_error("corrupted index, file is too small");
    }

    ndxfile.pread(&header, sizeof(OnDiskIndexHeader), 0);

    if (header.magic != DB_MAGIC) {
        throw std::runtime_error("invalid magic, not a catdata");
    }

    if (header.version != OnDiskIndex::VERSION) {
        throw std::runtime_error("unsupported version");
    }

    if (!is_valid_index_type(header.raw_type)) {
        throw std::runtime_error("invalid index type");
    }

    if (header.reserved != 0) {
        throw std::runtime_error("reserved field != 0");
    }

    ntype = static_cast<IndexType>(header.raw_type);
}